

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O0

void __thiscall
aeron::ClientConductor::onErrorResponse
          (ClientConductor *this,int64_t offendingCommandCorrelationId,int32_t errorCode,
          string *errorMessage)

{
  __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
  __last;
  __normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
  __last_00;
  __normal_iterator<aeron::ClientConductor::ExclusivePublicationStateDefn_*,_std::vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>_>
  __last_01;
  __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
  __last_02;
  bool bVar1;
  reference pSVar2;
  reference pPVar3;
  reference pEVar4;
  reference pCVar5;
  string *in_RCX;
  int32_t in_EDX;
  undefined8 in_RSI;
  __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
  counterIt;
  __normal_iterator<aeron::ClientConductor::ExclusivePublicationStateDefn_*,_std::vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>_>
  exPubIt;
  __normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
  pubIt;
  __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
  subIt;
  lock_guard<std::recursive_mutex> lock;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
  *in_stack_fffffffffffffe80;
  __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
  *this_00;
  anon_class_8_1_e3bcad48_for__M_pred in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
  in_stack_fffffffffffffea8;
  __normal_iterator<aeron::ClientConductor::ExclusivePublicationStateDefn_*,_std::vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>_>
  *this_01;
  __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
  local_c0;
  ExclusivePublicationStateDefn *local_b8;
  undefined8 local_b0;
  ExclusivePublicationStateDefn *local_a8;
  ExclusivePublicationStateDefn *local_a0;
  __normal_iterator<aeron::ClientConductor::ExclusivePublicationStateDefn_*,_std::vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>_>
  local_98;
  PublicationStateDefn *local_90;
  undefined8 local_88;
  PublicationStateDefn *local_80;
  PublicationStateDefn *local_78;
  __normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
  local_70;
  undefined4 local_64;
  SubscriptionStateDefn *local_60;
  undefined8 local_48;
  SubscriptionStateDefn *local_40;
  SubscriptionStateDefn *local_38;
  __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
  local_30 [2];
  string *local_20;
  int32_t local_14;
  undefined8 local_10;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_fffffffffffffe80,
             (mutex_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  local_38 = (SubscriptionStateDefn *)
             std::
             vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
             ::begin((vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
                      *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  local_40 = (SubscriptionStateDefn *)
             std::
             vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
             ::end((vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
                    *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  local_48 = local_10;
  __last._M_current._4_4_ = in_stack_fffffffffffffea4;
  __last._M_current._0_4_ = in_stack_fffffffffffffea0;
  local_30[0] = std::
                find_if<__gnu_cxx::__normal_iterator<aeron::ClientConductor::SubscriptionStateDefn*,std::vector<aeron::ClientConductor::SubscriptionStateDefn,std::allocator<aeron::ClientConductor::SubscriptionStateDefn>>>,aeron::ClientConductor::onErrorResponse(long,int,std::__cxx11::string_const&)::__0>
                          (in_stack_fffffffffffffea8,__last,
                           (anon_class_8_1_e3bcad48_for__M_pred)
                           in_stack_fffffffffffffe98.offendingCommandCorrelationId);
  local_60 = (SubscriptionStateDefn *)
             std::
             vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
             ::end((vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
                    *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  bVar1 = __gnu_cxx::operator!=
                    (in_stack_fffffffffffffe80,
                     (__normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
                      *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  if (bVar1) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
             ::operator*(local_30);
    pSVar2->m_status = ERRORED_MEDIA_DRIVER;
    pSVar2 = __gnu_cxx::
             __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
             ::operator*(local_30);
    pSVar2->m_errorCode = local_14;
    pSVar2 = __gnu_cxx::
             __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
             ::operator*(local_30);
    std::__cxx11::string::operator=((string *)&pSVar2->m_errorMessage,local_20);
    local_64 = 1;
  }
  else {
    local_78 = (PublicationStateDefn *)
               std::
               vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
               ::begin((vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
                        *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    local_80 = (PublicationStateDefn *)
               std::
               vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
               ::end((vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
                      *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    local_88 = local_10;
    __last_00._M_current._4_4_ = in_stack_fffffffffffffea4;
    __last_00._M_current._0_4_ = in_stack_fffffffffffffea0;
    local_70 = std::
               find_if<__gnu_cxx::__normal_iterator<aeron::ClientConductor::PublicationStateDefn*,std::vector<aeron::ClientConductor::PublicationStateDefn,std::allocator<aeron::ClientConductor::PublicationStateDefn>>>,aeron::ClientConductor::onErrorResponse(long,int,std::__cxx11::string_const&)::__1>
                         ((__normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
                           )in_stack_fffffffffffffea8._M_current,__last_00,
                          (anon_class_8_1_e3bcad48_for__M_pred)
                          in_stack_fffffffffffffe98.offendingCommandCorrelationId);
    local_90 = (PublicationStateDefn *)
               std::
               vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
               ::end((vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
                      *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
                        *)in_stack_fffffffffffffe80,
                       (__normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    if (bVar1) {
      pPVar3 = __gnu_cxx::
               __normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
               ::operator*(&local_70);
      pPVar3->m_status = ERRORED_MEDIA_DRIVER;
      pPVar3 = __gnu_cxx::
               __normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
               ::operator*(&local_70);
      pPVar3->m_errorCode = local_14;
      pPVar3 = __gnu_cxx::
               __normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
               ::operator*(&local_70);
      std::__cxx11::string::operator=((string *)&pPVar3->m_errorMessage,local_20);
      local_64 = 1;
    }
    else {
      local_a0 = (ExclusivePublicationStateDefn *)
                 std::
                 vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
                 ::begin((vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
                          *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      local_a8 = (ExclusivePublicationStateDefn *)
                 std::
                 vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
                 ::end((vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
                        *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      local_b0 = local_10;
      __last_01._M_current._4_4_ = in_stack_fffffffffffffea4;
      __last_01._M_current._0_4_ = in_stack_fffffffffffffea0;
      local_98 = std::
                 find_if<__gnu_cxx::__normal_iterator<aeron::ClientConductor::ExclusivePublicationStateDefn*,std::vector<aeron::ClientConductor::ExclusivePublicationStateDefn,std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>>>,aeron::ClientConductor::onErrorResponse(long,int,std::__cxx11::string_const&)::__2>
                           ((__normal_iterator<aeron::ClientConductor::ExclusivePublicationStateDefn_*,_std::vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>_>
                             )in_stack_fffffffffffffea8._M_current,__last_01,
                            (anon_class_8_1_e3bcad48_for__M_pred)
                            in_stack_fffffffffffffe98.offendingCommandCorrelationId);
      local_b8 = (ExclusivePublicationStateDefn *)
                 std::
                 vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
                 ::end((vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
                        *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<aeron::ClientConductor::ExclusivePublicationStateDefn_*,_std::vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>_>
                          *)in_stack_fffffffffffffe80,
                         (__normal_iterator<aeron::ClientConductor::ExclusivePublicationStateDefn_*,_std::vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      if (bVar1) {
        this_01 = &local_98;
        pEVar4 = __gnu_cxx::
                 __normal_iterator<aeron::ClientConductor::ExclusivePublicationStateDefn_*,_std::vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>_>
                 ::operator*(this_01);
        pEVar4->m_status = ERRORED_MEDIA_DRIVER;
        pEVar4 = __gnu_cxx::
                 __normal_iterator<aeron::ClientConductor::ExclusivePublicationStateDefn_*,_std::vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>_>
                 ::operator*(this_01);
        pEVar4->m_errorCode = local_14;
        pEVar4 = __gnu_cxx::
                 __normal_iterator<aeron::ClientConductor::ExclusivePublicationStateDefn_*,_std::vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>_>
                 ::operator*(this_01);
        std::__cxx11::string::operator=((string *)&pEVar4->m_errorMessage,local_20);
        local_64 = 1;
      }
      else {
        std::
        vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
        ::begin((vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
                 *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        std::
        vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
        ::end((vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
               *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        __last_02._M_current._4_4_ = in_stack_fffffffffffffea4;
        __last_02._M_current._0_4_ = in_stack_fffffffffffffea0;
        local_c0 = std::
                   find_if<__gnu_cxx::__normal_iterator<aeron::ClientConductor::CounterStateDefn*,std::vector<aeron::ClientConductor::CounterStateDefn,std::allocator<aeron::ClientConductor::CounterStateDefn>>>,aeron::ClientConductor::onErrorResponse(long,int,std::__cxx11::string_const&)::__3>
                             ((__normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
                               )in_stack_fffffffffffffea8._M_current,__last_02,
                              in_stack_fffffffffffffe98);
        std::
        vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
        ::end((vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
               *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
                            *)in_stack_fffffffffffffe80,
                           (__normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
                            *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        if (bVar1) {
          this_00 = &local_c0;
          pCVar5 = __gnu_cxx::
                   __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
                   ::operator*(this_00);
          pCVar5->m_status = ERRORED_MEDIA_DRIVER;
          pCVar5 = __gnu_cxx::
                   __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
                   ::operator*(this_00);
          pCVar5->m_errorCode = local_14;
          pCVar5 = __gnu_cxx::
                   __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
                   ::operator*(this_00);
          std::__cxx11::string::operator=((string *)&pCVar5->m_errorMessage,local_20);
          local_64 = 1;
        }
        else {
          local_64 = 0;
        }
      }
    }
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1c7710);
  return;
}

Assistant:

void ClientConductor::onErrorResponse(
    std::int64_t offendingCommandCorrelationId,
    std::int32_t errorCode,
    const std::string& errorMessage)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto subIt = std::find_if(m_subscriptions.begin(), m_subscriptions.end(),
        [offendingCommandCorrelationId](const SubscriptionStateDefn &entry)
        {
            return offendingCommandCorrelationId == entry.m_registrationId;
        });

    if (subIt != m_subscriptions.end())
    {
        (*subIt).m_status = RegistrationStatus::ERRORED_MEDIA_DRIVER;
        (*subIt).m_errorCode = errorCode;
        (*subIt).m_errorMessage = errorMessage;
        return;
    }

    auto pubIt = std::find_if(m_publications.begin(), m_publications.end(),
        [offendingCommandCorrelationId](const PublicationStateDefn &entry)
        {
            return offendingCommandCorrelationId == entry.m_registrationId;
        });

    if (pubIt != m_publications.end())
    {
        (*pubIt).m_status = RegistrationStatus::ERRORED_MEDIA_DRIVER;
        (*pubIt).m_errorCode = errorCode;
        (*pubIt).m_errorMessage = errorMessage;
        return;
    }

    auto exPubIt = std::find_if(m_exclusivePublications.begin(), m_exclusivePublications.end(),
        [offendingCommandCorrelationId](const ExclusivePublicationStateDefn &entry)
        {
            return offendingCommandCorrelationId == entry.m_registrationId;
        });

    if (exPubIt != m_exclusivePublications.end())
    {
        (*exPubIt).m_status = RegistrationStatus::ERRORED_MEDIA_DRIVER;
        (*exPubIt).m_errorCode = errorCode;
        (*exPubIt).m_errorMessage = errorMessage;
        return;
    }

    auto counterIt = std::find_if(m_counters.begin(), m_counters.end(),
        [offendingCommandCorrelationId](const CounterStateDefn &entry)
        {
            return offendingCommandCorrelationId == entry.m_registrationId;
        });

    if (counterIt != m_counters.end())
    {
        (*counterIt).m_status = RegistrationStatus::ERRORED_MEDIA_DRIVER;
        (*counterIt).m_errorCode = errorCode;
        (*counterIt).m_errorMessage = errorMessage;
        return;
    }
}